

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

char * nk_dtoa(char *s,double n)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  char *pcVar10;
  char *pcVar11;
  int n_00;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x1aa6,"char *nk_dtoa(char *, double)");
  }
  if ((n != 0.0) || (NAN(n))) {
    dVar15 = -n;
    if (-n <= n) {
      dVar15 = n;
    }
    dVar14 = -dVar15;
    if (-dVar15 <= dVar15) {
      dVar14 = dVar15;
    }
    iVar6 = 0;
    for (uVar4 = (uint)dVar14; 9 < (int)uVar4; uVar4 = uVar4 / 10) {
      iVar6 = iVar6 + 1;
    }
    bVar3 = 0.0 <= n;
    n_00 = -iVar6;
    if (0.0 <= dVar15) {
      n_00 = iVar6;
    }
    bVar2 = n_00 < 9;
    bVar12 = 0xffffffe9 < n_00 - 0xeU;
    pcVar10 = s;
    if (n < 0.0) {
      pcVar10 = s + 1;
      *s = '-';
    }
    if (bVar12 && (bVar2 || bVar3)) {
      uVar4 = 0;
      if (n_00 < 1) {
        n_00 = 0;
      }
    }
    else {
      uVar4 = (n_00 >> 0x1f) + n_00;
      n = nk_pow(n,uVar4);
      dVar15 = dVar15 / n;
      n_00 = 0;
    }
    while ((1e-14 < dVar15 || (-1 < n_00))) {
      n = nk_pow(n,n_00);
      if (0.0 < n) {
        iVar6 = (int)(dVar15 / n) - (uint)(dVar15 / n < 0.0);
        dVar15 = dVar15 - (double)iVar6 * n;
        *pcVar10 = (char)iVar6 + '0';
        pcVar10 = pcVar10 + 1;
      }
      bVar13 = n_00 == 0;
      n_00 = n_00 + -1;
      if ((bVar13) && (0.0 < dVar15)) {
        *pcVar10 = '.';
        pcVar10 = pcVar10 + 1;
      }
    }
    pcVar11 = pcVar10;
    if (!bVar12 || !bVar2 && !bVar3) {
      *pcVar10 = 'e';
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      pcVar10[1] = ((int)uVar4 < 1) * '\x02' + '+';
      lVar7 = 2;
      for (; uVar5 != 0; uVar5 = uVar5 / 10) {
        pcVar10[lVar7] = (byte)((ulong)uVar5 % 10) | 0x30;
        lVar7 = lVar7 + 1;
      }
      pcVar11 = pcVar10 + lVar7;
      lVar7 = lVar7 + -3;
      for (lVar8 = 0; lVar8 < lVar7; lVar8 = lVar8 + 1) {
        bVar9 = pcVar10[lVar8 + 2];
        bVar1 = pcVar10[lVar7 + 2];
        pcVar10[lVar8 + 2] = bVar9 ^ bVar1;
        bVar9 = bVar9 ^ bVar1 ^ pcVar10[lVar7 + 2];
        pcVar10[lVar7 + 2] = bVar9;
        pcVar10[lVar8 + 2] = pcVar10[lVar8 + 2] ^ bVar9;
        lVar7 = lVar7 + -1;
      }
    }
  }
  else {
    *s = '0';
    pcVar11 = s + 1;
  }
  *pcVar11 = '\0';
  return s;
}

Assistant:

NK_LIB char*
nk_dtoa(char *s, double n)
{
    int useExp = 0;
    int digit = 0, m = 0, m1 = 0;
    char *c = s;
    int neg = 0;

    NK_ASSERT(s);
    if (!s) return 0;

    if (n == 0.0) {
        s[0] = '0'; s[1] = '\0';
        return s;
    }

    neg = (n < 0);
    if (neg) n = -n;

    /* calculate magnitude */
    m = nk_log10(n);
    useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
    if (neg) *(c++) = '-';

    /* set up for scientific notation */
    if (useExp) {
        if (m < 0)
           m -= 1;
        n = n / (double)nk_pow(10.0, m);
        m1 = m;
        m = 0;
    }
    if (m < 1.0) {
        m = 0;
    }

    /* convert the number */
    while (n > NK_FLOAT_PRECISION || m >= 0) {
        double weight = nk_pow(10.0, m);
        if (weight > 0) {
            double t = (double)n / weight;
            digit = nk_ifloord(t);
            n -= ((double)digit * weight);
            *(c++) = (char)('0' + (char)digit);
        }
        if (m == 0 && n > 0)
            *(c++) = '.';
        m--;
    }

    if (useExp) {
        /* convert the exponent */
        int i, j;
        *(c++) = 'e';
        if (m1 > 0) {
            *(c++) = '+';
        } else {
            *(c++) = '-';
            m1 = -m1;
        }
        m = 0;
        while (m1 > 0) {
            *(c++) = (char)('0' + (char)(m1 % 10));
            m1 /= 10;
            m++;
        }
        c -= m;
        for (i = 0, j = m-1; i<j; i++, j--) {
            /* swap without temporary */
            c[i] ^= c[j];
            c[j] ^= c[i];
            c[i] ^= c[j];
        }
        c += m;
    }
    *(c) = '\0';
    return s;
}